

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Token * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseArgs
          (Parser *this,ArgParams *args,string *element_kind,bool *got_comma)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  string *in_RCX;
  long in_RSI;
  Token *in_RDI;
  byte *in_R8;
  Token comma;
  Fodder comma_fodder;
  AST *expr;
  Token maybe_eq;
  Fodder eq_fodder;
  Identifier *id;
  Fodder id_fodder;
  stringstream ss;
  Token next;
  bool first;
  Token *in_stack_fffffffffffff968;
  Token *in_stack_fffffffffffff970;
  Identifier *in_stack_fffffffffffff978;
  string *in_stack_fffffffffffff980;
  Token *in_stack_fffffffffffff988;
  Token *in_stack_fffffffffffff990;
  Token *in_stack_fffffffffffff998;
  Token *in_stack_fffffffffffff9a0;
  Allocator *in_stack_fffffffffffff9a8;
  Parser *in_stack_fffffffffffff9d8;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffa08;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffa10;
  int local_3a8;
  stringstream local_288 [16];
  ostream local_278 [376];
  int local_100;
  int local_f0;
  byte local_29;
  byte *local_28;
  string *local_20;
  
  *in_R8 = 0;
  local_29 = 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  do {
    peek((Parser *)0x292386);
    Token::Token(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    if (local_f0 == 8) {
      pop((Parser *)in_stack_fffffffffffff988);
      local_100 = 1;
    }
    else {
      if (((local_29 & 1) == 0) && ((*local_28 & 1) == 0)) {
        std::__cxx11::stringstream::stringstream(local_288);
        poVar2 = std::operator<<(local_278,"expected a comma before next ");
        poVar2 = std::operator<<(poVar2,local_20);
        std::operator<<(poVar2,".");
        uVar3 = __cxa_allocate_exception(0x60);
        std::__cxx11::stringstream::str();
        StaticError::StaticError
                  ((StaticError *)in_stack_fffffffffffff990,
                   (LocationRange *)in_stack_fffffffffffff988,in_stack_fffffffffffff980);
        __cxa_throw(uVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x29254c);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x292565);
      in_stack_fffffffffffff998 = peek((Parser *)0x29256f);
      if (in_stack_fffffffffffff998->kind == IDENTIFIER) {
        doublePeek((Parser *)in_stack_fffffffffffff988);
        if ((local_3a8 == 0xc) &&
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968),
           bVar1)) {
          in_stack_fffffffffffff990 = peek((Parser *)0x2925d1);
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::operator=(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
          in_stack_fffffffffffff980 = *(string **)(in_RSI + 8);
          in_stack_fffffffffffff988 = peek((Parser *)0x292603);
          Token::data32_abi_cxx11_(in_stack_fffffffffffff968);
          in_stack_fffffffffffff978 =
               Allocator::makeIdentifier
                         (in_stack_fffffffffffff9a8,(UString *)in_stack_fffffffffffff9a0);
          std::__cxx11::u32string::~u32string
                    ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)in_stack_fffffffffffff970);
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::operator=(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
          pop((Parser *)in_stack_fffffffffffff988);
          Token::~Token(in_stack_fffffffffffff970);
          pop((Parser *)in_stack_fffffffffffff988);
          Token::~Token(in_stack_fffffffffffff970);
        }
        Token::~Token(in_stack_fffffffffffff970);
      }
      in_stack_fffffffffffff970 =
           (Token *)parse(in_stack_fffffffffffff9d8,(uint)((ulong)in_RSI >> 0x20));
      *local_28 = 0;
      local_29 = 0;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x292762);
      in_stack_fffffffffffff968 = peek((Parser *)0x29276c);
      if (in_stack_fffffffffffff968->kind == COMMA) {
        pop((Parser *)in_stack_fffffffffffff988);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
        *local_28 = 1;
        Token::~Token(in_stack_fffffffffffff970);
      }
      std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>::
      emplace_back<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  *)in_stack_fffffffffffff9a0,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_fffffffffffff998,(Identifier **)in_stack_fffffffffffff990,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_fffffffffffff988,(AST **)in_stack_fffffffffffff980,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_fffffffffffff978);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_fffffffffffff980);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_fffffffffffff980);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_fffffffffffff980);
      local_100 = 0;
    }
    Token::~Token(in_stack_fffffffffffff970);
    if (local_100 != 0) {
      return in_RDI;
    }
  } while( true );
}

Assistant:

Token parseArgs(ArgParams &args, const std::string &element_kind, bool &got_comma)
    {
        got_comma = false;
        bool first = true;
        do {
            Token next = peek();
            if (next.kind == Token::PAREN_R) {
                // got_comma can be true or false here.
                return pop();
            }
            if (!first && !got_comma) {
                std::stringstream ss;
                ss << "expected a comma before next " << element_kind << ".";
                throw StaticError(next.location, ss.str());
            }
            // Either id=expr or id or expr, but note that expr could be id==1 so this needs
            // look-ahead.
            Fodder id_fodder;
            const Identifier *id = nullptr;
            Fodder eq_fodder;
            if (peek().kind == Token::IDENTIFIER) {
                Token maybe_eq = doublePeek();
                if (maybe_eq.kind == Token::OPERATOR && maybe_eq.data == "=") {
                    id_fodder = peek().fodder;
                    id = alloc->makeIdentifier(peek().data32());
                    eq_fodder = maybe_eq.fodder;
                    pop();  // id
                    pop();  // eq
                }
            }
            AST *expr = parse(MAX_PRECEDENCE);
            got_comma = false;
            first = false;
            Fodder comma_fodder;
            if (peek().kind == Token::COMMA) {
                Token comma = pop();
                comma_fodder = comma.fodder;
                got_comma = true;
            }
            args.emplace_back(id_fodder, id, eq_fodder, expr, comma_fodder);
        } while (true);
    }